

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O0

void __thiscall
slang::ast::Delay3Control::visitExprs<slang::ast::DriverVisitor&>
          (Delay3Control *this,DriverVisitor *visitor)

{
  Expression *in_RSI;
  DriverVisitor *in_RDI;
  
  Expression::visit<slang::ast::DriverVisitor&>(in_RSI,in_RDI);
  if (*(long *)((in_RDI->visitedValues).super_Storage.buffer + 8) != 0) {
    Expression::visit<slang::ast::DriverVisitor&>(in_RSI,in_RDI);
  }
  if (*(long *)((in_RDI->visitedValues).super_Storage.buffer + 0x10) != 0) {
    Expression::visit<slang::ast::DriverVisitor&>(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr1.visit(visitor);
        if (expr2)
            expr2->visit(visitor);
        if (expr3)
            expr3->visit(visitor);
    }